

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<signed_char,_unsigned_long,_4>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *t,unsigned_long *u,char *result)

{
  uint32_t uVar1;
  char *in_RDX;
  ulong *in_RSI;
  char *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (*in_RDI < '\0') {
    uVar1 = AbsValueHelper<signed_char,_0>::Abs('\0');
    *in_RDX = ((byte)((ulong)uVar1 % *in_RSI) ^ 0xff) + 1;
  }
  else {
    *in_RDX = (char)((ulong)(long)*in_RDI % *in_RSI);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //t could be negative - if so, need to convert to positive
        if(t < 0)
            result = (T)( ~( AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( t ) % u ) + 1);
        else
            result = (T)( (T)t % u );
    }